

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

string * __thiscall
kratos::LiftGenVarInstanceVisitor::find_common_instance_name_abi_cxx11_
          (string *__return_storage_ptr__,LiftGenVarInstanceVisitor *this,
          vector<kratos::ModuleInstantiationStmt_*,_std::allocator<kratos::ModuleInstantiationStmt_*>_>
          *generators)

{
  char cVar1;
  long lVar2;
  _func_int **pp_Var3;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  stringstream local_1d8 [8];
  stringstream gen_inst_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  lVar2 = *(long *)(*(this->super_IRVisitor)._vptr_IRVisitor + 0x160);
  if (*(long *)(lVar2 + 0xa0) != 0) {
    uVar7 = 0;
    do {
      pp_Var3 = (this->super_IRVisitor)._vptr_IRVisitor;
      uVar5 = *(long *)&(this->super_IRVisitor).level - (long)pp_Var3 >> 3;
      cVar1 = *(char *)(*(long *)(lVar2 + 0x98) + uVar7);
      if (1 < uVar5) {
        uVar6 = 1;
        do {
          if (*(char *)(*(long *)(*(long *)(pp_Var3[uVar6] + 0x160) + 0x98) + uVar7) != cVar1)
          goto LAB_00242a77;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      gen_inst_name._384_1_ = cVar1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&gen_inst_name.field_0x8,&gen_inst_name.field_0x180,1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < *(ulong *)(lVar2 + 0xa0));
  }
LAB_00242a77:
  std::__cxx11::stringbuf::str();
  sVar4 = __return_storage_ptr__->_M_string_length;
  if ((__return_storage_ptr__->_M_dataplus)._M_p[sVar4 - 1] == '_') {
    do {
      std::__cxx11::string::substr((ulong)&gen_inst_name.field_0x180,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)&gen_inst_name.field_0x180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(gen_inst_name._385_7_,gen_inst_name._384_1_) != &local_40) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(gen_inst_name._385_7_,gen_inst_name._384_1_),
                        local_40._M_allocated_capacity + 1);
      }
      sVar4 = __return_storage_ptr__->_M_string_length;
    } while ((__return_storage_ptr__->_M_dataplus)._M_p[sVar4 - 1] == '_');
  }
  if (sVar4 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gen_inst_name.field_0x180,"genblk_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(*(this->super_IRVisitor)._vptr_IRVisitor + 0x160) + 0x78));
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)&gen_inst_name.field_0x180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(gen_inst_name._385_7_,gen_inst_name._384_1_) != &local_40) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(gen_inst_name._385_7_,gen_inst_name._384_1_),
                      local_40._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::ios_base::~ios_base((ios_base *)&gen_inst_name.field_0x78);
  return __return_storage_ptr__;
}

Assistant:

static std::string find_common_instance_name(
        const std::vector<ModuleInstantiationStmt*>& generators) {
        std::stringstream gen_inst_name;
        auto const& inst_ref = generators[0]->target()->instance_name;
        for (uint64_t s = 0; s < inst_ref.size(); s++) {
            bool diff = false;
            for (uint64_t i = 1; i < generators.size(); i++) {
                auto const& c = generators[i]->target()->instance_name[s];
                if (c != inst_ref[s]) {
                    diff = true;
                    break;
                }
            }
            if (diff) {
                break;
            } else {
                gen_inst_name << inst_ref[s];
            }
        }
        auto str = gen_inst_name.str();
        // remote _ at the end
        while (str[str.size() - 1] == '_') {
            str = str.substr(0, str.size() - 1);
        }
        // if it's empty, use gen_blk and the definition name
        if (str.empty()) {
            str = "genblk_" + generators[0]->target()->name;
        }
        return str;
    }